

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O1

void dill_raw_putreg(dill_stream_conflict s,dill_reg reg,int type)

{
  long *plVar1;
  private_ctx pdVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 1L << ((byte)reg & 0x3f);
  pdVar2 = s->p;
  if (type - 9U < 2) {
    if (((pdVar2->tmp_f).members[0] & uVar4) != 0) {
      plVar1 = (pdVar2->tmp_f).avail;
      *plVar1 = *plVar1 | uVar4;
      return;
    }
    uVar3 = (pdVar2->var_f).members[0];
    if ((uVar3 & uVar4) != 0) {
LAB_00107f94:
      dill_alloc_specific(s,reg,type,0);
      return;
    }
    if (reg != -1 || uVar3 != 0) {
LAB_00107f9b:
      printf("Putreg not in set error %d\n");
      return;
    }
  }
  else {
    if (((pdVar2->tmp_i).members[0] & uVar4) == 0) {
      if (((pdVar2->var_i).members[0] & uVar4) == 0) goto LAB_00107f9b;
      goto LAB_00107f94;
    }
    plVar1 = (pdVar2->tmp_i).avail;
    *plVar1 = *plVar1 | uVar4;
  }
  return;
}

Assistant:

extern void
dill_raw_putreg(dill_stream s, dill_reg reg, int type)
{
    switch (type) {
    case DILL_F:
    case DILL_D:
        if (BIT_ON(reg, s->p->tmp_f.members)) {
            dill_alloc_specific(s, reg, type, DILL_TEMP);
        } else if (BIT_ON(reg, s->p->var_f.members)) {
            dill_alloc_specific(s, reg, type, DILL_VAR);
        } else {
            /*
             * special case, if the put reg is invalid (-1) and
             * the member set is empty, give no warning.
             */
            if ((s->p->var_f.members[0] != 0) || (reg != -1)) {
                printf("Putreg not in set error %d\n", reg);
            }
        }
        break;
    default:
        if (BIT_ON(reg, s->p->tmp_i.members)) {
            dill_alloc_specific(s, reg, type, DILL_TEMP);
        } else if (BIT_ON(reg, s->p->var_i.members)) {
            dill_alloc_specific(s, reg, type, DILL_VAR);
        } else {
            printf("Putreg not in set error %d\n", reg);
        }
        break;
    }
}